

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O3

int dwarf_get_DS_name(uint val,char **s_out)

{
  int iVar1;
  
  iVar1 = -1;
  if (val - 1 < 5) {
    *s_out = &DAT_001ab58c + *(int *)(&DAT_001ab58c + (ulong)(val - 1) * 4);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
dwarf_get_DS_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_DS_unsigned:
        *s_out = "DW_DS_unsigned";
        return DW_DLV_OK;
    case DW_DS_leading_overpunch:
        *s_out = "DW_DS_leading_overpunch";
        return DW_DLV_OK;
    case DW_DS_trailing_overpunch:
        *s_out = "DW_DS_trailing_overpunch";
        return DW_DLV_OK;
    case DW_DS_leading_separate:
        *s_out = "DW_DS_leading_separate";
        return DW_DLV_OK;
    case DW_DS_trailing_separate:
        *s_out = "DW_DS_trailing_separate";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}